

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fstack.cpp
# Opt level: O1

void fstk_RunMacro(char *macroName,MacroArgs *args)

{
  FileStackNode *pFVar1;
  uint uVar2;
  uint32_t uVar3;
  Symbol *__s;
  MacroArgs *pMVar4;
  size_t __n;
  size_t sVar5;
  FileStackNode *fileInfo;
  LexerState *pLVar6;
  int *piVar7;
  char *pcVar8;
  long lVar9;
  FileStackNode *pFVar10;
  ulong uVar11;
  
  __s = sym_FindExactSymbol(macroName);
  if (__s == (Symbol *)0x0) {
    pcVar8 = "Macro \"%s\" not defined\n";
  }
  else {
    if (__s->type == SYM_MACRO) {
      pMVar4 = macro_GetCurrentArgs();
      contextStack->macroArgs = pMVar4;
      pFVar10 = __s->src;
      lVar9 = 0x2b;
      if (pFVar10->type == NODE_REPT) {
        pFVar1 = pFVar10 + 1;
        do {
          pFVar10 = pFVar10->parent;
        } while (pFVar10->type == NODE_REPT);
        lVar9 = (ulong)*(uint *)&pFVar1->parent * 0x11 + 0x2b;
      }
      pFVar1 = pFVar10 + 1;
      __n = strlen((char *)pFVar1);
      sVar5 = strlen(__s->name);
      fileInfo = (FileStackNode *)malloc(lVar9 + sVar5 + __n);
      if (fileInfo == (FileStackNode *)0x0) {
        piVar7 = __errno_location();
        pcVar8 = strerror(*piVar7);
        error("Failed to alloc file info for \"%s\": %s\n",__s,pcVar8);
        return;
      }
      fileInfo->type = NODE_MACRO;
      memcpy(fileInfo + 1,pFVar1,__n);
      pcVar8 = (char *)((long)&fileInfo[1].parent + __n);
      if (pFVar10->type == NODE_REPT) {
        for (uVar11 = (ulong)*(uint *)&pFVar1->parent; uVar11 != 0; uVar11 = uVar11 - 1) {
          uVar2 = sprintf(pcVar8,"::REPT~%u",(ulong)*(uint *)((long)&pFVar1->parent + uVar11 * 4));
          if ((int)uVar2 < 0) {
            piVar7 = __errno_location();
            pcVar8 = strerror(*piVar7);
            fatalerror("Failed to write macro invocation info: %s\n",pcVar8);
          }
          pcVar8 = pcVar8 + uVar2;
        }
      }
      pcVar8[0] = ':';
      pcVar8[1] = ':';
      memcpy(pcVar8 + 2,__s,sVar5 + 1);
      newContext(fileInfo);
      pLVar6 = lexer_OpenFileView("MACRO",(__s->field_8).field_2.macro,
                                  (__s->field_8).field_2.macroSize,__s->fileLine);
      contextStack->lexerState = pLVar6;
      if (pLVar6 != (LexerState *)0x0) {
        lexerStateEOL = pLVar6;
        uVar3 = macro_UseNewUniqueID();
        contextStack->uniqueID = uVar3;
        macro_UseNewArgs(args);
        return;
      }
      fatalerror("Failed to set up lexer for macro invocation\n");
    }
    pcVar8 = "\"%s\" is not a macro\n";
  }
  error(pcVar8,macroName);
  return;
}

Assistant:

void fstk_RunMacro(char const *macroName, struct MacroArgs *args)
{
	struct Symbol *macro = sym_FindExactSymbol(macroName);

	if (!macro) {
		error("Macro \"%s\" not defined\n", macroName);
		return;
	}
	if (macro->type != SYM_MACRO) {
		error("\"%s\" is not a macro\n", macroName);
		return;
	}
	contextStack->macroArgs = macro_GetCurrentArgs();

	// Compute total length of this node's name: <base name>::<macro>
	size_t reptNameLen = 0;
	struct FileStackNode const *node = macro->src;

	if (node->type == NODE_REPT) {
		struct FileStackReptNode const *reptNode = (struct FileStackReptNode const *)node;

		// 4294967295 = 2^32 - 1, aka UINT32_MAX
		reptNameLen += reptNode->reptDepth * strlen("::REPT~4294967295");
		// Look for next named node
		do {
			node = node->parent;
		} while (node->type == NODE_REPT);
	}
	struct FileStackNamedNode const *baseNode = (struct FileStackNamedNode const *)node;
	size_t baseLen = strlen(baseNode->name);
	size_t macroNameLen = strlen(macro->name);
	struct FileStackNamedNode *fileInfo = (struct FileStackNamedNode *)malloc(sizeof(*fileInfo) +
			baseLen + reptNameLen + 2 + macroNameLen + 1);

	if (!fileInfo) {
		error("Failed to alloc file info for \"%s\": %s\n", macro->name, strerror(errno));
		return;
	}
	fileInfo->node.type = NODE_MACRO;
	// Print the name...
	char *dest = fileInfo->name;

	memcpy(dest, baseNode->name, baseLen);
	dest += baseLen;
	if (node->type == NODE_REPT) {
		struct FileStackReptNode const *reptNode = (struct FileStackReptNode const *)node;

		for (uint32_t i = reptNode->reptDepth; i--; ) {
			int nbChars = sprintf(dest, "::REPT~%" PRIu32, reptNode->iters[i]);

			if (nbChars < 0)
				fatalerror("Failed to write macro invocation info: %s\n",
					   strerror(errno));
			dest += nbChars;
		}
	}
	*dest++ = ':';
	*dest++ = ':';
	memcpy(dest, macro->name, macroNameLen + 1);

	newContext((struct FileStackNode *)fileInfo);
	contextStack->lexerState = lexer_OpenFileView("MACRO", macro->macro, macro->macroSize,
						      macro->fileLine);
	if (!contextStack->lexerState)
		fatalerror("Failed to set up lexer for macro invocation\n");
	lexer_SetStateAtEOL(contextStack->lexerState);
	contextStack->uniqueID = macro_UseNewUniqueID();
	macro_UseNewArgs(args);
}